

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.hpp
# Opt level: O0

void __thiscall
cs::compiler_type::build_line
          (compiler_type *this,deque<char,_std::allocator<char>_> *buff,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *ast,size_t line_num,charset encoding)

{
  bool bVar1;
  _Self *__y;
  compiler_type *this_00;
  _Self *in_RDI;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *line;
  iterator __end2;
  iterator __begin2;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *__range2;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> tokens;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *in_stack_00000100;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_stack_00000108;
  compiler_type *in_stack_00000110;
  charset in_stack_0000075c;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_stack_00000760;
  deque<char,_std::allocator<char>_> *in_stack_00000768;
  compiler_type *in_stack_00000770;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *line_00;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_stack_ffffffffffffff60;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_78;
  
  line_00 = &local_78;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)0x1324fe);
  process_char_buff(in_stack_00000770,in_stack_00000768,in_stack_00000760,in_stack_0000075c);
  __y = (_Self *)token_base::operator_new((size_t)in_RDI);
  token_endline::token_endline((token_endline *)in_RDI,(size_t)__y);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::push_back
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_RDI,(value_type *)__y)
  ;
  process_token_buff(in_stack_00000110,in_stack_00000108,in_stack_00000100);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::begin((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           *)__y);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::end((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
         *)__y);
  while( true ) {
    bVar1 = std::operator!=(in_RDI,__y);
    if (!bVar1) break;
    this_00 = (compiler_type *)
              std::
              _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
              ::operator*((_Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
                           *)&stack0xffffffffffffff48);
    process_line(this_00,line_00);
    std::
    _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
    ::operator++(in_RDI);
  }
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque(in_stack_ffffffffffffff60)
  ;
  return;
}

Assistant:

void
		build_line(const std::deque<char> &buff, std::deque<std::deque<token_base *>> &ast, std::size_t line_num = 1,
		           charset encoding = charset::utf8)
		{
			std::deque<token_base *> tokens;
			process_char_buff(buff, tokens, encoding);
			tokens.push_back(new token_endline(line_num));
			process_token_buff(tokens, ast);
			for (auto &line: ast)
				process_line(line);
		}